

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_concat(lua_State *L,int total)

{
  char cVar1;
  StkId pSVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  TString *pTVar6;
  long lVar7;
  long lVar8;
  ulong l;
  StkId obj;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  StkId pSVar12;
  char buff [40];
  char local_58 [40];
  
  if (total != 1) {
    do {
      pSVar2 = (L->top).p;
      if ((byte)((*(byte *)((long)pSVar2 + -0x18) & 0xf) - 3) < 2) {
        pSVar12 = pSVar2 + -1;
        bVar4 = *(byte *)((long)pSVar2 + -8) & 0xf;
        if (bVar4 != 4) {
          if (bVar4 != 3) goto LAB_00125797;
          luaO_tostring(L,&pSVar12->val);
        }
        obj = pSVar2 + -2;
        cVar1 = *(char *)((long)pSVar2 + -8);
        if ((cVar1 == 'D') && ((pSVar12->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
          iVar10 = 1;
          if ((undefined1  [16])((undefined1  [16])*pSVar2 & (undefined1  [16])0xf) ==
              (undefined1  [16])0x3) {
            luaO_tostring(L,&obj->val);
          }
        }
        else {
          if ((*(char *)((long)pSVar2 + -0x18) == 'D') &&
             ((obj->val).value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
            pSVar2[-2].val.value_ = pSVar2[-1].val.value_;
            *(char *)((long)pSVar2 + -0x18) = cVar1;
            goto LAB_0012579f;
          }
          l = (ulong)*(byte *)(*(long *)pSVar12 + 0xb);
          if (l == 0xff) {
            l = *(ulong *)(*(long *)pSVar12 + 0x10);
          }
          uVar11 = 1;
          if (1 < total) {
            uVar11 = 1;
            do {
              bVar4 = (obj->val).tt_ & 0xf;
              if (bVar4 != 4) {
                if (bVar4 != 3) goto LAB_00125713;
                luaO_tostring(L,&obj->val);
              }
              uVar5 = (ulong)*(byte *)(*(long *)obj + 0xb);
              if (uVar5 == 0xff) {
                uVar5 = *(ulong *)(*(long *)obj + 0x10);
              }
              if (0x7fffffffffffffdf - l <= uVar5) {
                (L->top).p = pSVar2 + -(ulong)(uint)total;
                luaG_runerror(L,"string length overflow");
              }
              l = l + uVar5;
              uVar11 = uVar11 + 1;
              obj = obj + -1;
            } while ((uint)total != uVar11);
            uVar11 = (ulong)(uint)total;
          }
LAB_00125713:
          uVar5 = uVar11 & 0xffffffff;
          if (l < 0x29) {
            lVar7 = uVar5 + 1;
            pSVar12 = pSVar2 + -uVar5;
            lVar8 = 0;
            do {
              lVar3 = *(long *)pSVar12;
              sVar9 = (size_t)*(byte *)(lVar3 + 0xb);
              if (sVar9 == 0xff) {
                sVar9 = *(size_t *)(lVar3 + 0x10);
              }
              memcpy(local_58 + lVar8,(void *)(lVar3 + 0x18),sVar9);
              lVar8 = lVar8 + sVar9;
              lVar7 = lVar7 + -1;
              pSVar12 = pSVar12 + 1;
            } while (1 < lVar7);
            pTVar6 = luaS_newlstr(L,local_58,l);
          }
          else {
            pTVar6 = luaS_createlngstrobj(L,l);
            lVar7 = uVar5 + 1;
            pSVar12 = pSVar2 + -uVar5;
            lVar8 = 0;
            do {
              lVar3 = *(long *)pSVar12;
              sVar9 = (size_t)*(byte *)(lVar3 + 0xb);
              if (sVar9 == 0xff) {
                sVar9 = *(size_t *)(lVar3 + 0x10);
              }
              memcpy(pTVar6->contents + lVar8,(void *)(lVar3 + 0x18),sVar9);
              lVar8 = lVar8 + sVar9;
              lVar7 = lVar7 + -1;
              pSVar12 = pSVar12 + 1;
            } while (1 < lVar7);
          }
          *(TString **)(pSVar2 + -uVar5) = pTVar6;
          pSVar2[-uVar5].val.tt_ = pTVar6->tt | 0x40;
          iVar10 = (int)uVar11 + -1;
        }
      }
      else {
LAB_00125797:
        luaT_tryconcatTM(L);
LAB_0012579f:
        iVar10 = 1;
      }
      total = total - iVar10;
      (L->top).p = (L->top).p + -(long)iVar10;
    } while (1 < total);
  }
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  if (total == 1)
    return;  /* "all" values already concatenated */
  do {
    StkId top = L->top.p;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(s2v(top - 2)) || cvt2str(s2v(top - 2))) ||
        !tostring(L, s2v(top - 1)))
      luaT_tryconcatTM(L);  /* may invalidate 'top' */
    else if (isemptystr(s2v(top - 1)))  /* second operand is empty? */
      cast_void(tostring(L, s2v(top - 2)));  /* result is first operand */
    else if (isemptystr(s2v(top - 2))) {  /* first operand is empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsslen(tsvalue(s2v(top - 1)));
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, s2v(top - n - 1)); n++) {
        size_t l = tsslen(tsvalue(s2v(top - n - 1)));
        if (l_unlikely(l >= MAX_SIZE - sizeof(TString) - tl)) {
          L->top.p = top - total;  /* pop strings to avoid wasting stack */
          luaG_runerror(L, "string length overflow");
        }
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getlngstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n - 1;  /* got 'n' strings to create one new */
    L->top.p -= n - 1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}